

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

string * gimage::(anonymous_namespace)::readRAWHeader_abi_cxx11_
                   (char *name,int *type,bool *msbfirst,long *width,long *height)

{
  byte bVar1;
  long lVar2;
  void *this;
  istream *piVar3;
  istream *message;
  istream *this_00;
  undefined8 uVar4;
  undefined1 *in_RCX;
  int *in_RDX;
  char *in_RSI;
  string *in_RDI;
  long *in_R8;
  long *in_R9;
  Properties prop;
  char order;
  char sep2;
  char sep1;
  istringstream in;
  size_t pos;
  string s;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  string *psVar5;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  Properties *in_stack_fffffffffffffcc0;
  string local_2a8 [37];
  char local_283 [2];
  allocator local_281;
  string local_280 [102];
  char local_21a;
  char local_219;
  string local_218 [32];
  istringstream local_1f8 [256];
  char *in_stack_ffffffffffffff08;
  bool *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  Properties *in_stack_ffffffffffffff20;
  allocator local_51;
  string local_50 [32];
  long *local_30;
  long *local_28;
  undefined1 *local_20;
  int *local_18;
  char *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RSI,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::string(in_RDI);
  lVar2 = std::__cxx11::string::find((char)local_50,0x26);
  if (lVar2 == -1) {
    std::__cxx11::string::operator=(in_RDI,local_50);
    psVar5 = local_50;
    lVar2 = std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)psVar5,lVar2 - 4,(char *)0x4);
    std::__cxx11::string::c_str();
    gutil::Properties::Properties
              (in_stack_fffffffffffffcc0,
               (char *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    gutil::Properties::getValue<long>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(long *)in_stack_ffffffffffffff10
               ,in_stack_ffffffffffffff08);
    gutil::Properties::getValue<long>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(long *)in_stack_ffffffffffffff10
               ,in_stack_ffffffffffffff08);
    gutil::Properties::getValue<int>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    gutil::Properties::getValue<bool>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    gutil::Properties::~Properties((Properties *)0x181e62);
  }
  else {
    std::__cxx11::string::substr((ulong)local_218,(ulong)local_50);
    std::__cxx11::istringstream::istringstream(local_1f8,local_218,_S_in);
    std::__cxx11::string::~string(local_218);
    local_219 = '\0';
    local_21a = '\0';
    this = (void *)std::istream::operator>>(local_1f8,std::noskipws);
    piVar3 = (istream *)std::istream::operator>>(this,local_28);
    piVar3 = std::operator>>(piVar3,&local_219);
    message = (istream *)std::istream::operator>>(piVar3,local_30);
    this_00 = std::operator>>(message,&local_21a);
    std::istream::operator>>(this_00,local_18);
    bVar1 = std::ios::fail();
    if ((((bVar1 & 1) != 0) || (local_219 != 'x')) || (local_21a != 'x')) {
      local_283[1] = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,local_10,&local_281);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                     in_stack_fffffffffffffcb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                     (char *)in_stack_fffffffffffffcb0);
      gutil::IOException::IOException((IOException *)piVar3,(string *)message);
      local_283[1] = 0;
      __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    *local_20 = 0;
    bVar1 = std::ios::eof();
    if (((bVar1 & 1) == 0) && (std::operator>>((istream *)local_1f8,local_283), local_283[0] == 'm')
       ) {
      *local_20 = 1;
    }
    std::__cxx11::string::substr((ulong)local_2a8,(ulong)local_50);
    std::__cxx11::string::operator=(in_RDI,local_2a8);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::istringstream::~istringstream(local_1f8);
  }
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string readRAWHeader(const char *name, int &type, bool &msbfirst, long &width,
                          long &height)
{
  std::string s=name;
  size_t pos;
  std::string ret;

  pos=s.find('&');

  if (pos != s.npos)
  {
    std::istringstream in(s.substr(pos+1));
    char sep1=0, sep2=0;

    in >> std::noskipws >> width >> sep1 >> height >> sep2 >> type;

    if (in.fail() || sep1 != 'x' || sep2 != 'x')
    {
      throw gutil::IOException("Wrong format of RAW header information ("+std::string(name)+")");
    }

    msbfirst=false;

    if (!in.eof())
    {
      char order;

      in >> order;

      if (order == 'm')
      {
        msbfirst=true;
      }
    }

    ret=s.substr(0, pos);
  }
  else
  {
    ret=s;
    s.replace(s.length()-4, 4, ".hdr");

    gutil::Properties prop(s.c_str());
    prop.getValue("image.width", width);
    prop.getValue("image.height", height);
    prop.getValue("image.pixelsize", type);
    prop.getValue("image.msbfirst", msbfirst, "false");
  }

  return ret;
}